

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall FOptionMenuItemOption::SetSelection(FOptionMenuItemOption *this,int Selection)

{
  FOptionValues **ppFVar1;
  uint uVar2;
  FOptionValues *pFVar3;
  Pair *pPVar4;
  Node *pNVar5;
  UCVarValue value_00;
  Node *pNVar6;
  UCVarValue value;
  UCVarValue local_20;
  
  uVar2 = *(uint *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24;
  pNVar5 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar2);
  while ((pNVar6 = pNVar5, pNVar6 != (Node *)0x0 && (pNVar6->Next != (Node *)0x1))) {
    pNVar5 = pNVar6->Next;
    if ((pNVar6->Pair).Key.Index == uVar2) {
LAB_0033094a:
      ppFVar1 = &(pNVar6->Pair).Value;
      if ((((pNVar6 != (Node *)0x0) && (pFVar3 = *ppFVar1, pFVar3 != (FOptionValues *)0x0)) &&
          (this->mCVar != (FBaseCVar *)0x0)) && ((pFVar3->mValues).Count != 0)) {
        pPVar4 = (pFVar3->mValues).Array;
        if (*(int *)((pPVar4->TextValue).Chars + -0xc) != 0) {
          value_00.String = FString::LockBuffer(&pPVar4[Selection].TextValue);
          FBaseCVar::SetGenericRep(this->mCVar,value_00,CVAR_String);
          FString::UnlockBuffer(&((*ppFVar1)->mValues).Array[Selection].TextValue);
          return;
        }
        local_20.Float = (float)pPVar4[Selection].Value;
        FBaseCVar::SetGenericRep(this->mCVar,local_20,CVAR_Float);
        return;
      }
      return;
    }
  }
  pNVar6 = (Node *)0x0;
  goto LAB_0033094a;
}

Assistant:

void SetSelection(int Selection)
	{
		UCVarValue value;
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && mCVar != NULL && (*opt)->mValues.Size() > 0)
		{
			if ((*opt)->mValues[0].TextValue.IsEmpty())
			{
				value.Float = (float)(*opt)->mValues[Selection].Value;
				mCVar->SetGenericRep (value, CVAR_Float);
			}
			else
			{
				value.String = (*opt)->mValues[Selection].TextValue.LockBuffer();
				mCVar->SetGenericRep (value, CVAR_String);
				(*opt)->mValues[Selection].TextValue.UnlockBuffer();
			}
		}
	}